

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

void add_pax_attr_time(archive_string *as,char *key,int64_t sec,unsigned_long nanos)

{
  bool bVar1;
  char *pcVar2;
  char *value;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char tmp [50];
  char acStack_19 [9];
  
  pcVar2 = acStack_19 + 2;
  acStack_19[2] = 0;
  uVar3 = 0xb;
  do {
    uVar3 = uVar3 - 1;
    uVar4 = nanos / 10;
    uVar5 = nanos % 10;
    if (uVar3 < 2) break;
    nanos = uVar4;
  } while (uVar5 == 0);
  if (1 < uVar3) {
    pcVar2 = acStack_19 + 1;
    do {
      *pcVar2 = "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar5 + 0x35];
      uVar5 = uVar4 % 10;
      pcVar2 = pcVar2 + -1;
      uVar3 = uVar3 - 1;
      uVar4 = uVar4 / 10;
    } while (1 < (int)uVar3);
    *pcVar2 = '.';
  }
  uVar4 = -sec;
  if (0 < sec) {
    uVar4 = sec;
  }
  pcVar2 = pcVar2 + -1;
  do {
    value = pcVar2;
    *value = "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar4 % 10 + 0x35];
    pcVar2 = value + -1;
    bVar1 = 9 < uVar4;
    uVar4 = uVar4 / 10;
  } while (bVar1);
  if (sec < 0) {
    *pcVar2 = '-';
    value = pcVar2;
  }
  add_pax_attr(as,key,value);
  return;
}

Assistant:

static void
add_pax_attr_time(struct archive_string *as, const char *key,
    int64_t sec, unsigned long nanos)
{
	int digit, i;
	char *t;
	/*
	 * Note that each byte contributes fewer than 3 base-10
	 * digits, so this will always be big enough.
	 */
	char tmp[1 + 3*sizeof(sec) + 1 + 3*sizeof(nanos)];

	tmp[sizeof(tmp) - 1] = 0;
	t = tmp + sizeof(tmp) - 1;

	/* Skip trailing zeros in the fractional part. */
	for (digit = 0, i = 10; i > 0 && digit == 0; i--) {
		digit = nanos % 10;
		nanos /= 10;
	}

	/* Only format the fraction if it's non-zero. */
	if (i > 0) {
		while (i > 0) {
			*--t = "0123456789"[digit];
			digit = nanos % 10;
			nanos /= 10;
			i--;
		}
		*--t = '.';
	}
	t = format_int(t, sec);

	add_pax_attr(as, key, t);
}